

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void __thiscall
google::protobuf::Reflection::SwapFieldsImpl<false>
          (Reflection *this,Message *message1,Message *message2,
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          *fields)

{
  MessageFactory *pMVar1;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *pvVar2;
  Message *lhs;
  bool bVar3;
  int iVar4;
  int number;
  Reflection *pRVar5;
  LogMessage *pLVar6;
  string *psVar7;
  Descriptor *pDVar8;
  undefined4 extraout_var;
  reference ppFVar9;
  ExtensionSet *this_00;
  ExtensionSet *other;
  OneofDescriptor *pOVar10;
  char *pcVar11;
  int __c;
  FieldDescriptor *__s;
  _Self local_128;
  _Self local_120;
  key_type local_114;
  FieldDescriptor *pFStack_110;
  int oneof_index;
  FieldDescriptor *field;
  const_iterator __end2;
  const_iterator __begin2;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *__range2;
  Message *prototype;
  set<int,_std::less<int>,_std::allocator<int>_> swapped_oneof;
  LogMessage local_b0;
  LogFinisher local_75 [20];
  byte local_61;
  LogMessage local_60;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *local_28;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *fields_local;
  Message *message2_local;
  Message *message1_local;
  Reflection *this_local;
  
  if (message1 != message2) {
    local_28 = fields;
    fields_local = (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    *)message2;
    message2_local = message1;
    message1_local = (Message *)this;
    pRVar5 = Message::GetReflection(message1);
    local_61 = 0;
    if (pRVar5 != this) {
      internal::LogMessage::LogMessage
                (&local_60,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
                 ,0x3d1);
      local_61 = 1;
      pLVar6 = internal::LogMessage::operator<<
                         (&local_60,"CHECK failed: (message1->GetReflection()) == (this): ");
      pLVar6 = internal::LogMessage::operator<<(pLVar6,"First argument to SwapFields() (of type \"")
      ;
      pDVar8 = Message::GetDescriptor(message2_local);
      psVar7 = Descriptor::full_name_abi_cxx11_(pDVar8);
      pLVar6 = internal::LogMessage::operator<<(pLVar6,psVar7);
      pLVar6 = internal::LogMessage::operator<<
                         (pLVar6,
                          "\") is not compatible with this reflection object (which is for type \"")
      ;
      psVar7 = Descriptor::full_name_abi_cxx11_(this->descriptor_);
      pLVar6 = internal::LogMessage::operator<<(pLVar6,psVar7);
      pLVar6 = internal::LogMessage::operator<<
                         (pLVar6,
                          "\").  Note that the exact same class is required; not just the same descriptor."
                         );
      internal::LogFinisher::operator=(local_75,pLVar6);
    }
    if ((local_61 & 1) != 0) {
      internal::LogMessage::~LogMessage(&local_60);
    }
    pRVar5 = Message::GetReflection((Message *)fields_local);
    swapped_oneof._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 0;
    if (pRVar5 != this) {
      internal::LogMessage::LogMessage
                (&local_b0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
                 ,0x3d9);
      swapped_oneof._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 1;
      pLVar6 = internal::LogMessage::operator<<
                         (&local_b0,"CHECK failed: (message2->GetReflection()) == (this): ");
      pLVar6 = internal::LogMessage::operator<<
                         (pLVar6,"Second argument to SwapFields() (of type \"");
      pDVar8 = Message::GetDescriptor((Message *)fields_local);
      psVar7 = Descriptor::full_name_abi_cxx11_(pDVar8);
      pLVar6 = internal::LogMessage::operator<<(pLVar6,psVar7);
      pLVar6 = internal::LogMessage::operator<<
                         (pLVar6,
                          "\") is not compatible with this reflection object (which is for type \"")
      ;
      psVar7 = Descriptor::full_name_abi_cxx11_(this->descriptor_);
      pLVar6 = internal::LogMessage::operator<<(pLVar6,psVar7);
      pLVar6 = internal::LogMessage::operator<<
                         (pLVar6,
                          "\").  Note that the exact same class is required; not just the same descriptor."
                         );
      internal::LogFinisher::operator=
                ((LogFinisher *)
                 ((long)&swapped_oneof._M_t._M_impl.super__Rb_tree_header._M_node_count + 6),pLVar6)
      ;
    }
    if ((swapped_oneof._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ & 1) != 0) {
      internal::LogMessage::~LogMessage(&local_b0);
    }
    std::set<int,_std::less<int>,_std::allocator<int>_>::set
              ((set<int,_std::less<int>,_std::allocator<int>_> *)&prototype);
    pMVar1 = this->message_factory_;
    pDVar8 = Message::GetDescriptor(message2_local);
    iVar4 = (*pMVar1->_vptr_MessageFactory[2])(pMVar1,pDVar8);
    pvVar2 = local_28;
    __end2 = std::
             vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ::begin(local_28);
    field = (FieldDescriptor *)
            std::
            vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ::end(pvVar2);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_google::protobuf::FieldDescriptor_*const_*,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                                       *)&field), bVar3) {
      ppFVar9 = __gnu_cxx::
                __normal_iterator<const_google::protobuf::FieldDescriptor_*const_*,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                ::operator*(&__end2);
      pFStack_110 = *ppFVar9;
      anon_unknown_0::CheckInvalidAccess(&this->schema_,pFStack_110);
      bVar3 = FieldDescriptor::is_extension(pFStack_110);
      if (bVar3) {
        this_00 = MutableExtensionSet(this,message2_local);
        other = MutableExtensionSet(this,(Message *)fields_local);
        number = FieldDescriptor::number(pFStack_110);
        internal::ExtensionSet::SwapExtension
                  (this_00,(MessageLite *)CONCAT44(extraout_var,iVar4),other,number);
      }
      else {
        __s = pFStack_110;
        bVar3 = internal::ReflectionSchema::InRealOneof(&this->schema_,pFStack_110);
        if (bVar3) {
          pOVar10 = FieldDescriptor::containing_oneof(pFStack_110);
          pcVar11 = OneofDescriptor::index(pOVar10,(char *)__s,__c);
          local_114 = (key_type)pcVar11;
          local_120._M_node =
               (_Base_ptr)
               std::set<int,_std::less<int>,_std::allocator<int>_>::find
                         ((set<int,_std::less<int>,_std::allocator<int>_> *)&prototype,&local_114);
          local_128._M_node =
               (_Base_ptr)
               std::set<int,_std::less<int>,_std::allocator<int>_>::end
                         ((set<int,_std::less<int>,_std::allocator<int>_> *)&prototype);
          bVar3 = std::operator!=(&local_120,&local_128);
          if (!bVar3) {
            std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                      ((set<int,_std::less<int>,_std::allocator<int>_> *)&prototype,&local_114);
            lhs = message2_local;
            pvVar2 = fields_local;
            pOVar10 = FieldDescriptor::containing_oneof(pFStack_110);
            SwapOneofField<false>(this,lhs,(Message *)pvVar2,pOVar10);
          }
        }
        else {
          SwapField(this,message2_local,(Message *)fields_local,pFStack_110);
          bVar3 = FieldDescriptor::is_repeated(pFStack_110);
          if (!bVar3) {
            SwapBit(this,message2_local,(Message *)fields_local,pFStack_110);
          }
        }
      }
      __gnu_cxx::
      __normal_iterator<const_google::protobuf::FieldDescriptor_*const_*,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
      ::operator++(&__end2);
    }
    std::set<int,_std::less<int>,_std::allocator<int>_>::~set
              ((set<int,_std::less<int>,_std::allocator<int>_> *)&prototype);
  }
  return;
}

Assistant:

void Reflection::SwapFieldsImpl(
    Message* message1, Message* message2,
    const std::vector<const FieldDescriptor*>& fields) const {
  if (message1 == message2) return;

  // TODO(kenton):  Other Reflection methods should probably check this too.
  GOOGLE_CHECK_EQ(message1->GetReflection(), this)
      << "First argument to SwapFields() (of type \""
      << message1->GetDescriptor()->full_name()
      << "\") is not compatible with this reflection object (which is for type "
         "\""
      << descriptor_->full_name()
      << "\").  Note that the exact same class is required; not just the same "
         "descriptor.";
  GOOGLE_CHECK_EQ(message2->GetReflection(), this)
      << "Second argument to SwapFields() (of type \""
      << message2->GetDescriptor()->full_name()
      << "\") is not compatible with this reflection object (which is for type "
         "\""
      << descriptor_->full_name()
      << "\").  Note that the exact same class is required; not just the same "
         "descriptor.";

  std::set<int> swapped_oneof;

  GOOGLE_DCHECK(!unsafe_shallow_swap || message1->GetArenaForAllocation() ==
                                     message2->GetArenaForAllocation());

  const Message* prototype =
      message_factory_->GetPrototype(message1->GetDescriptor());
  for (const auto* field : fields) {
    CheckInvalidAccess(schema_, field);
    if (field->is_extension()) {
      if (unsafe_shallow_swap) {
        MutableExtensionSet(message1)->UnsafeShallowSwapExtension(
            MutableExtensionSet(message2), field->number());
      } else {
        MutableExtensionSet(message1)->SwapExtension(
            prototype, MutableExtensionSet(message2), field->number());
      }
    } else {
      if (schema_.InRealOneof(field)) {
        int oneof_index = field->containing_oneof()->index();
        // Only swap the oneof field once.
        if (swapped_oneof.find(oneof_index) != swapped_oneof.end()) {
          continue;
        }
        swapped_oneof.insert(oneof_index);
        SwapOneofField<unsafe_shallow_swap>(message1, message2,
                                            field->containing_oneof());
      } else {
        // Swap field.
        if (unsafe_shallow_swap) {
          UnsafeShallowSwapField(message1, message2, field);
        } else {
          SwapField(message1, message2, field);
        }
        // Swap has bit for non-repeated fields.  We have already checked for
        // oneof already. This has to be done after SwapField, because SwapField
        // may depend on the information in has bits.
        if (!field->is_repeated()) {
          SwapBit(message1, message2, field);
        }
      }
    }
  }
}